

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeader_p.cpp
# Opt level: O0

string * __thiscall
BamTools::Internal::HttpResponseHeader::GetReason_abi_cxx11_(HttpResponseHeader *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x48));
  return in_RDI;
}

Assistant:

std::string HttpResponseHeader::GetReason() const
{
    return m_reason;
}